

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cc
# Opt level: O0

ostream * avro::operator<<(ostream *os,Type type)

{
  bool bVar1;
  Type in_ESI;
  ostream *in_RDI;
  
  bVar1 = isAvroTypeOrPseudoType(in_ESI);
  if (bVar1) {
    std::operator<<(in_RDI,(string *)(strings::typeToString_abi_cxx11_ + (long)in_ESI * 0x20));
  }
  else {
    std::ostream::operator<<(in_RDI,in_ESI);
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<< (std::ostream &os, Type type)
{
    if(isAvroTypeOrPseudoType(type)) {
        os << strings::typeToString[type];
    }
    else {
        os << static_cast<int>(type);
    }
    return os;
}